

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall QtMWidgets::Picker::Picker(Picker *this,QWidget *parent,WindowFlags f)

{
  Scroller *pSVar1;
  PickerPrivate *this_00;
  undefined4 *puVar2;
  undefined4 in_register_00000014;
  Picker *ctx;
  QObject local_48 [8];
  code *local_40;
  ImplFn local_38;
  code *local_30;
  undefined8 local_28;
  
  QWidget::QWidget(&this->super_QWidget,parent,CONCAT44(in_register_00000014,f.i));
  *(undefined ***)this = &PTR_metaObject_001934d0;
  *(undefined ***)&this->field_0x10 = &PTR__Picker_00193680;
  this_00 = (PickerPrivate *)operator_new(0x88);
  ctx = this;
  PickerPrivate::PickerPrivate(this_00,this);
  (this->d).d = this_00;
  PickerPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  pSVar1 = ((this->d).d)->scroller;
  local_30 = Scroller::scroll;
  local_28 = 0;
  local_40 = _q_scroll;
  local_38 = (ImplFn)0x0;
  puVar2 = (undefined4 *)operator_new(0x20);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QSlotObject<void_(QtMWidgets::Picker::*)(int,_int),_QtPrivate::List<int,_int>,_void>::impl;
  *(code **)(puVar2 + 4) = _q_scroll;
  *(undefined8 *)(puVar2 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pSVar1,(QObject *)&local_30,(void **)this,
             (QSlotObjectBase *)&local_40,(ConnectionType)puVar2,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  return;
}

Assistant:

Picker::Picker( QWidget * parent, Qt::WindowFlags f )
	:	QWidget( parent, f )
	,	d( new PickerPrivate( this ) )
{
	d->init();

	connect( d->scroller, &Scroller::scroll,
		this, &Picker::_q_scroll );
}